

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

string * __thiscall
trompeloeil::params_string<trompeloeil::wildcard,trompeloeil::wildcard>
          (string *__return_storage_ptr__,trompeloeil *this,
          tuple<trompeloeil::wildcard,_trompeloeil::wildcard> *t)

{
  ostringstream os;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  stream_params<0ul,1ul,trompeloeil::wildcard,trompeloeil::wildcard>(local_190,this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string
  params_string(
    std::tuple<T...> const& t)
  {
    std::ostringstream os;
    stream_params(os, t);
    return os.str();
  }